

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

size_type __thiscall
lf::fe::FeHierarchicQuad<double>::NumRefShapeFunctions(FeHierarchicQuad<double> *this,dim_t codim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  runtime_error *this_00;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (codim == 2) {
    sVar5 = 1;
  }
  else if (codim == 1) {
    uVar3 = (this->edge_degrees_)._M_elems[0];
    if (((uVar3 != (this->edge_degrees_)._M_elems[1]) ||
        (uVar3 != (this->edge_degrees_)._M_elems[2])) ||
       (uVar3 != (this->edge_degrees_)._M_elems[3])) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,
                 "You cannot call this method with codim=1 if the edges of the quad have a differing number of shape functions."
                 ,0x6d);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "edge_degrees_[0] == edge_degrees_[1] && edge_degrees_[0] == edge_degrees_[2] && edge_degrees_[0] == edge_degrees_[3]"
                 ,"");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_1e8,&local_208,0x4ba,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar5 = uVar3 - 1;
  }
  else {
    if (codim != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Illegal codim ",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      paVar1 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
      paVar2 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_1e8,&local_208,0x4bf,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
      local_208._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,"");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      base::AssertionFailed(&local_1e8,&local_208,0x4bf,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      abort();
    }
    iVar4 = this->interior_degree_ - 1;
    sVar5 = iVar4 * iVar4;
  }
  return sVar5;
}

Assistant:

[[nodiscard]] lf::base::size_type NumRefShapeFunctions(
      dim_t codim) const override {
    switch (codim) {
      case 0:
        return (interior_degree_ - 1) * (interior_degree_ - 1);
      case 1:
        LF_VERIFY_MSG(
            edge_degrees_[0] == edge_degrees_[1] &&
                edge_degrees_[0] == edge_degrees_[2] &&
                edge_degrees_[0] == edge_degrees_[3],
            "You cannot call this method with codim=1 if the edges of the "
            "quad have a differing number of shape functions.");
        return edge_degrees_[0] - 1;
      case 2:
        return 1;
      default:
        LF_ASSERT_MSG(false, "Illegal codim " << codim);
        // Silence compiler warnings
        return 0;
    }
  }